

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linked_definitions_section.cpp
# Opt level: O0

void anon_unknown.dwarf_256343::check_linked_definition(database *db,value_type *link)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  value_pointer_type ppVar4;
  element_type *peVar5;
  Message *message;
  definition *pdVar6;
  element_type *peVar7;
  AssertHelper local_2b8;
  Message local_2b0;
  address local_2a8;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_2;
  address local_288;
  address definition_address;
  uintptr_t offset;
  Message local_270;
  size_type local_264;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_1;
  shared_ptr<const_pstore::repo::compilation> compilation;
  AssertHelper local_238;
  Message local_230;
  const_iterator local_228;
  undefined1 local_138 [8];
  AssertionResult gtest_ar;
  undefined1 local_118 [8];
  const_iterator pos;
  shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  compilation_index;
  value_type *link_local;
  database *db_local;
  
  pstore::index::
  get_index<(pstore::trailer::indices)0,pstore::database_const,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const>
            ((index *)&pos.pos_,db,true);
  peVar2 = std::
           __shared_ptr_access<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pos.pos_);
  pstore::index::
  hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
  ::find<pstore::uint128,void>
            ((const_iterator *)local_118,
             (hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
              *)peVar2,db,&link->compilation);
  peVar2 = std::
           __shared_ptr_access<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pos.pos_);
  pstore::index::
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  ::end(&local_228,peVar2,db);
  testing::internal::
  CmpHelperNE<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>>
            ((internal *)local_138,"pos","compilation_index->end (db)",
             (iterator_base<true> *)local_118,&local_228);
  pstore::index::
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  ::iterator_base<true>::~iterator_base(&local_228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
               ,0x6c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  if (bVar1) {
    ppVar4 = pstore::index::
             hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
             ::iterator_base<true>::operator->((iterator_base<true> *)local_118);
    pstore::repo::compilation::load((compilation *)&gtest_ar_1.message_,db,&ppVar4->second);
    peVar5 = std::
             __shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&gtest_ar_1.message_);
    local_264 = pstore::repo::compilation::size(peVar5);
    testing::internal::CmpHelperLT<unsigned_int,unsigned_int>
              ((internal *)local_260,"link.index","compilation->size ()",&link->index,&local_264);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
    if (!bVar1) {
      testing::Message::Message(&local_270);
      message = testing::Message::operator<<
                          (&local_270,
                           (char (*) [68])
                           "index must lie within the number of definitions in this compilation");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&offset,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                 ,0x70,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&offset,message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&offset);
      testing::Message::~Message(&local_270);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
    if (bVar1) {
      peVar5 = std::
               __shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&gtest_ar_1.message_);
      pdVar6 = pstore::repo::compilation::operator[](peVar5,(ulong)link->index);
      peVar7 = std::__shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                           *)&gtest_ar_1.message_);
      definition_address.a_ = (long)pdVar6 - (long)peVar7;
      ppVar4 = pstore::index::
               hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
               ::iterator_base<true>::operator->((iterator_base<true> *)local_118);
      gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )pstore::typed_address<pstore::repo::compilation>::to_address(&(ppVar4->second).addr);
      local_288 = pstore::operator+((address)gtest_ar_2.message_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl,definition_address.a_);
      local_2a8 = pstore::typed_address<pstore::repo::definition>::to_address(&link->pointer);
      testing::internal::EqHelper::Compare<pstore::address,_pstore::address,_nullptr>
                ((EqHelper *)local_2a0,"definition_address","link.pointer.to_address ()",&local_288,
                 &local_2a8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
      if (!bVar1) {
        testing::Message::Message(&local_2b0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_linked_definitions_section.cpp"
                   ,0x79,pcVar3);
        testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
        testing::internal::AssertHelper::~AssertHelper(&local_2b8);
        testing::Message::~Message(&local_2b0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
    }
    std::shared_ptr<const_pstore::repo::compilation>::~shared_ptr
              ((shared_ptr<const_pstore::repo::compilation> *)&gtest_ar_1.message_);
  }
  pstore::index::
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  ::iterator_base<true>::~iterator_base((iterator_base<true> *)local_118);
  std::
  shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  ::~shared_ptr((shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                 *)&pos.pos_);
  return;
}

Assistant:

void check_linked_definition (database const & db,
                                  repo::linked_definitions::value_type const & link) {
        // Find and load the compilation that link references.
        auto const compilation_index =
            pstore::index::get_index<pstore::trailer::indices::compilation> (db);
        auto const pos = compilation_index->find (db, link.compilation);
        ASSERT_NE (pos, compilation_index->end (db));

        std::shared_ptr<repo::compilation const> const compilation =
            repo::compilation::load (db, pos->second);
        ASSERT_LT (link.index, compilation->size ())
            << "index must lie within the number of definitions in this compilation";

        // Compute the offset of the link.index definition from the start of the compilation's
        // storage (c).
        auto const offset = reinterpret_cast<std::uintptr_t> (&(*compilation)[link.index]) -
                            reinterpret_cast<std::uintptr_t> (compilation.get ());
        // Compute the address of the link.index definition.
        auto const definition_address = pos->second.addr.to_address () + offset;
        ASSERT_EQ (definition_address, link.pointer.to_address ());
    }